

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O0

uint8 * __thiscall
google::protobuf::internal::ExtensionSet::Extension::InternalSerializeFieldWithCachedSizesToArray
          (Extension *this,int number,bool deterministic,uint8 *target)

{
  int iVar1;
  Type TVar2;
  int iVar3;
  uint *puVar4;
  int *piVar5;
  long *plVar6;
  unsigned_long *puVar7;
  float *pfVar8;
  double *pdVar9;
  bool *pbVar10;
  LogMessage *other;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  MessageLite *pMVar12;
  int local_f0;
  int local_ec;
  int i_31;
  int i_30;
  int i_29;
  int i_28;
  int i_27;
  int i_26;
  int i_25;
  int i_24;
  int i_23;
  int i_22;
  int i_21;
  int i_20;
  int i_19;
  int i_18;
  int i_17;
  int i_16;
  int i_15;
  int i_14;
  LogMessage local_98;
  int local_60;
  int local_5c;
  int i_13;
  int i_12;
  int i_11;
  int i_10;
  int i_9;
  int i_8;
  int i_7;
  int i_6;
  int i_5;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int i;
  uint8 *target_local;
  bool deterministic_local;
  Extension *pEStack_18;
  int number_local;
  Extension *this_local;
  
  _i_1 = target;
  target_local._3_1_ = deterministic;
  target_local._4_4_ = number;
  pEStack_18 = this;
  if ((this->is_repeated & 1U) == 0) {
    if ((this->field_0xa & 1) == 0) {
      TVar2 = real_type(this->type);
      switch(TVar2) {
      case TYPE_DOUBLE:
        _i_1 = WireFormatLite::WriteDoubleToArray
                         (target_local._4_4_,(this->field_0).double_value,_i_1);
        break;
      case TYPE_FLOAT:
        _i_1 = WireFormatLite::WriteFloatToArray
                         (target_local._4_4_,(this->field_0).float_value,_i_1);
        break;
      case TYPE_INT64:
        _i_1 = WireFormatLite::WriteInt64ToArray
                         (target_local._4_4_,(this->field_0).int64_value,_i_1);
        break;
      case TYPE_UINT64:
        _i_1 = WireFormatLite::WriteUInt64ToArray
                         (target_local._4_4_,(this->field_0).uint64_value,_i_1);
        break;
      case TYPE_INT32:
        _i_1 = WireFormatLite::WriteInt32ToArray
                         (target_local._4_4_,(this->field_0).int32_value,_i_1);
        break;
      case TYPE_FIXED64:
        _i_1 = WireFormatLite::WriteFixed64ToArray
                         (target_local._4_4_,(this->field_0).uint64_value,_i_1);
        break;
      case TYPE_FIXED32:
        _i_1 = WireFormatLite::WriteFixed32ToArray
                         (target_local._4_4_,(this->field_0).uint32_value,_i_1);
        break;
      case TYPE_BOOL:
        _i_1 = WireFormatLite::WriteBoolToArray
                         (target_local._4_4_,(bool)((this->field_0).bool_value & 1),_i_1);
        break;
      case TYPE_STRING:
        _i_1 = WireFormatLite::WriteStringToArray
                         (target_local._4_4_,(this->field_0).string_value,_i_1);
        break;
      case TYPE_GROUP:
        _i_1 = WireFormatLite::WriteGroupToArray
                         (target_local._4_4_,(this->field_0).message_value,_i_1);
        break;
      case TYPE_MESSAGE:
        if (((byte)this->field_0xa >> 4 & 1) == 0) {
          _i_1 = WireFormatLite::InternalWriteMessageToArray
                           (target_local._4_4_,(this->field_0).message_value,
                            (bool)(target_local._3_1_ & 1),_i_1);
        }
        else {
          _i_1 = (uint8 *)(**(code **)((((this->field_0).repeated_string_value)->
                                       super_RepeatedPtrFieldBase).arena_ + 0x88))
                                    ((this->field_0).repeated_string_value,target_local._4_4_,
                                     target_local._3_1_ & 1,_i_1);
        }
        break;
      case TYPE_BYTES:
        _i_1 = WireFormatLite::WriteBytesToArray
                         (target_local._4_4_,(this->field_0).string_value,_i_1);
        break;
      case TYPE_UINT32:
        _i_1 = WireFormatLite::WriteUInt32ToArray
                         (target_local._4_4_,(this->field_0).uint32_value,_i_1);
        break;
      case TYPE_ENUM:
        _i_1 = WireFormatLite::WriteEnumToArray(target_local._4_4_,(this->field_0).enum_value,_i_1);
        break;
      case TYPE_SFIXED32:
        _i_1 = WireFormatLite::WriteSFixed32ToArray
                         (target_local._4_4_,(this->field_0).int32_value,_i_1);
        break;
      case TYPE_SFIXED64:
        _i_1 = WireFormatLite::WriteSFixed64ToArray
                         (target_local._4_4_,(this->field_0).int64_value,_i_1);
        break;
      case TYPE_SINT32:
        _i_1 = WireFormatLite::WriteSInt32ToArray
                         (target_local._4_4_,(this->field_0).int32_value,_i_1);
        break;
      case MAX_TYPE:
        _i_1 = WireFormatLite::WriteSInt64ToArray
                         (target_local._4_4_,(this->field_0).int64_value,_i_1);
      }
    }
  }
  else if ((this->is_packed & 1U) == 0) {
    TVar2 = real_type(this->type);
    switch(TVar2) {
    case TYPE_DOUBLE:
      for (i_27 = 0; iVar3 = RepeatedField<double>::size((this->field_0).repeated_double_value),
          iVar1 = target_local._4_4_, i_27 < iVar3; i_27 = i_27 + 1) {
        pdVar9 = RepeatedField<double>::Get((this->field_0).repeated_double_value,i_27);
        _i_1 = WireFormatLite::WriteDoubleToArray(iVar1,*pdVar9,_i_1);
      }
      break;
    case TYPE_FLOAT:
      for (i_26 = 0; iVar3 = RepeatedField<float>::size((this->field_0).repeated_float_value),
          iVar1 = target_local._4_4_, i_26 < iVar3; i_26 = i_26 + 1) {
        pfVar8 = RepeatedField<float>::Get((this->field_0).repeated_float_value,i_26);
        _i_1 = WireFormatLite::WriteFloatToArray(iVar1,*pfVar8,_i_1);
      }
      break;
    case TYPE_INT64:
      for (i_17 = 0; iVar3 = RepeatedField<long>::size((this->field_0).repeated_int64_value),
          iVar1 = target_local._4_4_, i_17 < iVar3; i_17 = i_17 + 1) {
        plVar6 = RepeatedField<long>::Get((this->field_0).repeated_int64_value,i_17);
        _i_1 = WireFormatLite::WriteInt64ToArray(iVar1,*plVar6,_i_1);
      }
      break;
    case TYPE_UINT64:
      for (i_19 = 0;
          iVar3 = RepeatedField<unsigned_long>::size((this->field_0).repeated_uint64_value),
          iVar1 = target_local._4_4_, i_19 < iVar3; i_19 = i_19 + 1) {
        puVar7 = RepeatedField<unsigned_long>::Get((this->field_0).repeated_uint64_value,i_19);
        _i_1 = WireFormatLite::WriteUInt64ToArray(iVar1,*puVar7,_i_1);
      }
      break;
    case TYPE_INT32:
      for (i_16 = 0; iVar3 = RepeatedField<int>::size((this->field_0).repeated_int32_value),
          iVar1 = target_local._4_4_, i_16 < iVar3; i_16 = i_16 + 1) {
        piVar5 = RepeatedField<int>::Get((this->field_0).repeated_int32_value,i_16);
        _i_1 = WireFormatLite::WriteInt32ToArray(iVar1,*piVar5,_i_1);
      }
      break;
    case TYPE_FIXED64:
      for (i_23 = 0;
          iVar3 = RepeatedField<unsigned_long>::size((this->field_0).repeated_uint64_value),
          iVar1 = target_local._4_4_, i_23 < iVar3; i_23 = i_23 + 1) {
        puVar7 = RepeatedField<unsigned_long>::Get((this->field_0).repeated_uint64_value,i_23);
        _i_1 = WireFormatLite::WriteFixed64ToArray(iVar1,*puVar7,_i_1);
      }
      break;
    case TYPE_FIXED32:
      for (i_22 = 0;
          iVar3 = RepeatedField<unsigned_int>::size((this->field_0).repeated_uint32_value),
          iVar1 = target_local._4_4_, i_22 < iVar3; i_22 = i_22 + 1) {
        puVar4 = RepeatedField<unsigned_int>::Get((this->field_0).repeated_uint32_value,i_22);
        _i_1 = WireFormatLite::WriteFixed32ToArray(iVar1,*puVar4,_i_1);
      }
      break;
    case TYPE_BOOL:
      for (i_28 = 0; iVar3 = RepeatedField<bool>::size((this->field_0).repeated_bool_value),
          iVar1 = target_local._4_4_, i_28 < iVar3; i_28 = i_28 + 1) {
        pbVar10 = RepeatedField<bool>::Get((this->field_0).repeated_bool_value,i_28);
        _i_1 = WireFormatLite::WriteBoolToArray(iVar1,(bool)(*pbVar10 & 1),_i_1);
      }
      break;
    case TYPE_STRING:
      for (i_29 = 0;
          iVar3 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::size((this->field_0).repeated_string_value), iVar1 = target_local._4_4_,
          i_29 < iVar3; i_29 = i_29 + 1) {
        pbVar11 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::Get((this->field_0).repeated_string_value,i_29);
        _i_1 = WireFormatLite::WriteStringToArray(iVar1,pbVar11,_i_1);
      }
      break;
    case TYPE_GROUP:
      for (local_ec = 0;
          iVar3 = RepeatedPtrField<google::protobuf::MessageLite>::size
                            ((this->field_0).repeated_message_value), iVar1 = target_local._4_4_,
          local_ec < iVar3; local_ec = local_ec + 1) {
        pMVar12 = RepeatedPtrField<google::protobuf::MessageLite>::Get
                            ((this->field_0).repeated_message_value,local_ec);
        _i_1 = WireFormatLite::InternalWriteGroupToArray
                         (iVar1,pMVar12,(bool)(target_local._3_1_ & 1),_i_1);
      }
      break;
    case TYPE_MESSAGE:
      for (local_f0 = 0;
          iVar3 = RepeatedPtrField<google::protobuf::MessageLite>::size
                            ((this->field_0).repeated_message_value), iVar1 = target_local._4_4_,
          local_f0 < iVar3; local_f0 = local_f0 + 1) {
        pMVar12 = RepeatedPtrField<google::protobuf::MessageLite>::Get
                            ((this->field_0).repeated_message_value,local_f0);
        _i_1 = WireFormatLite::InternalWriteMessageToArray
                         (iVar1,pMVar12,(bool)(target_local._3_1_ & 1),_i_1);
      }
      break;
    case TYPE_BYTES:
      for (i_30 = 0;
          iVar3 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::size((this->field_0).repeated_string_value), iVar1 = target_local._4_4_,
          i_30 < iVar3; i_30 = i_30 + 1) {
        pbVar11 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::Get((this->field_0).repeated_string_value,i_30);
        _i_1 = WireFormatLite::WriteBytesToArray(iVar1,pbVar11,_i_1);
      }
      break;
    case TYPE_UINT32:
      for (i_18 = 0;
          iVar3 = RepeatedField<unsigned_int>::size((this->field_0).repeated_uint32_value),
          iVar1 = target_local._4_4_, i_18 < iVar3; i_18 = i_18 + 1) {
        puVar4 = RepeatedField<unsigned_int>::Get((this->field_0).repeated_uint32_value,i_18);
        _i_1 = WireFormatLite::WriteUInt32ToArray(iVar1,*puVar4,_i_1);
      }
      break;
    case TYPE_ENUM:
      for (i_31 = 0; iVar3 = RepeatedField<int>::size((this->field_0).repeated_int32_value),
          iVar1 = target_local._4_4_, i_31 < iVar3; i_31 = i_31 + 1) {
        piVar5 = RepeatedField<int>::Get((this->field_0).repeated_int32_value,i_31);
        _i_1 = WireFormatLite::WriteEnumToArray(iVar1,*piVar5,_i_1);
      }
      break;
    case TYPE_SFIXED32:
      for (i_24 = 0; iVar3 = RepeatedField<int>::size((this->field_0).repeated_int32_value),
          iVar1 = target_local._4_4_, i_24 < iVar3; i_24 = i_24 + 1) {
        piVar5 = RepeatedField<int>::Get((this->field_0).repeated_int32_value,i_24);
        _i_1 = WireFormatLite::WriteSFixed32ToArray(iVar1,*piVar5,_i_1);
      }
      break;
    case TYPE_SFIXED64:
      for (i_25 = 0; iVar3 = RepeatedField<long>::size((this->field_0).repeated_int64_value),
          iVar1 = target_local._4_4_, i_25 < iVar3; i_25 = i_25 + 1) {
        plVar6 = RepeatedField<long>::Get((this->field_0).repeated_int64_value,i_25);
        _i_1 = WireFormatLite::WriteSFixed64ToArray(iVar1,*plVar6,_i_1);
      }
      break;
    case TYPE_SINT32:
      for (i_20 = 0; iVar3 = RepeatedField<int>::size((this->field_0).repeated_int32_value),
          iVar1 = target_local._4_4_, i_20 < iVar3; i_20 = i_20 + 1) {
        piVar5 = RepeatedField<int>::Get((this->field_0).repeated_int32_value,i_20);
        _i_1 = WireFormatLite::WriteSInt32ToArray(iVar1,*piVar5,_i_1);
      }
      break;
    case MAX_TYPE:
      for (i_21 = 0; iVar3 = RepeatedField<long>::size((this->field_0).repeated_int64_value),
          iVar1 = target_local._4_4_, i_21 < iVar3; i_21 = i_21 + 1) {
        plVar6 = RepeatedField<long>::Get((this->field_0).repeated_int64_value,i_21);
        _i_1 = WireFormatLite::WriteSInt64ToArray(iVar1,*plVar6,_i_1);
      }
    }
  }
  else {
    if (this->cached_size == 0) {
      return target;
    }
    _i_1 = WireFormatLite::WriteTagToArray(number,WIRETYPE_LENGTH_DELIMITED,target);
    _i_1 = WireFormatLite::WriteInt32NoTagToArray(this->cached_size,_i_1);
    TVar2 = real_type(this->type);
    switch(TVar2) {
    case TYPE_DOUBLE:
      for (i_13 = 0; iVar1 = i_13,
          iVar3 = RepeatedField<double>::size((this->field_0).repeated_double_value), iVar1 < iVar3;
          i_13 = i_13 + 1) {
        pdVar9 = RepeatedField<double>::Get((this->field_0).repeated_double_value,i_13);
        _i_1 = WireFormatLite::WriteDoubleNoTagToArray(*pdVar9,_i_1);
      }
      break;
    case TYPE_FLOAT:
      for (i_12 = 0; iVar1 = i_12,
          iVar3 = RepeatedField<float>::size((this->field_0).repeated_float_value), iVar1 < iVar3;
          i_12 = i_12 + 1) {
        pfVar8 = RepeatedField<float>::Get((this->field_0).repeated_float_value,i_12);
        _i_1 = WireFormatLite::WriteFloatNoTagToArray(*pfVar8,_i_1);
      }
      break;
    case TYPE_INT64:
      for (i_3 = 0; iVar1 = i_3,
          iVar3 = RepeatedField<long>::size((this->field_0).repeated_int64_value), iVar1 < iVar3;
          i_3 = i_3 + 1) {
        plVar6 = RepeatedField<long>::Get((this->field_0).repeated_int64_value,i_3);
        _i_1 = WireFormatLite::WriteInt64NoTagToArray(*plVar6,_i_1);
      }
      break;
    case TYPE_UINT64:
      for (i_5 = 0; iVar1 = i_5,
          iVar3 = RepeatedField<unsigned_long>::size((this->field_0).repeated_uint64_value),
          iVar1 < iVar3; i_5 = i_5 + 1) {
        puVar7 = RepeatedField<unsigned_long>::Get((this->field_0).repeated_uint64_value,i_5);
        _i_1 = WireFormatLite::WriteUInt64NoTagToArray(*puVar7,_i_1);
      }
      break;
    case TYPE_INT32:
      for (i_2 = 0; iVar1 = i_2,
          iVar3 = RepeatedField<int>::size((this->field_0).repeated_int32_value), iVar1 < iVar3;
          i_2 = i_2 + 1) {
        piVar5 = RepeatedField<int>::Get((this->field_0).repeated_int32_value,i_2);
        _i_1 = WireFormatLite::WriteInt32NoTagToArray(*piVar5,_i_1);
      }
      break;
    case TYPE_FIXED64:
      for (i_9 = 0; iVar1 = i_9,
          iVar3 = RepeatedField<unsigned_long>::size((this->field_0).repeated_uint64_value),
          iVar1 < iVar3; i_9 = i_9 + 1) {
        puVar7 = RepeatedField<unsigned_long>::Get((this->field_0).repeated_uint64_value,i_9);
        _i_1 = WireFormatLite::WriteFixed64NoTagToArray(*puVar7,_i_1);
      }
      break;
    case TYPE_FIXED32:
      for (i_8 = 0; iVar1 = i_8,
          iVar3 = RepeatedField<unsigned_int>::size((this->field_0).repeated_uint32_value),
          iVar1 < iVar3; i_8 = i_8 + 1) {
        puVar4 = RepeatedField<unsigned_int>::Get((this->field_0).repeated_uint32_value,i_8);
        _i_1 = WireFormatLite::WriteFixed32NoTagToArray(*puVar4,_i_1);
      }
      break;
    case TYPE_BOOL:
      for (local_5c = 0; iVar1 = local_5c,
          iVar3 = RepeatedField<bool>::size((this->field_0).repeated_bool_value), iVar1 < iVar3;
          local_5c = local_5c + 1) {
        pbVar10 = RepeatedField<bool>::Get((this->field_0).repeated_bool_value,local_5c);
        _i_1 = WireFormatLite::WriteBoolNoTagToArray((bool)(*pbVar10 & 1),_i_1);
      }
      break;
    case TYPE_STRING:
    case TYPE_GROUP:
    case TYPE_MESSAGE:
    case TYPE_BYTES:
      LogMessage::LogMessage
                (&local_98,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set_heavy.cc"
                 ,0x1f0);
      other = LogMessage::operator<<(&local_98,"Non-primitive types can\'t be packed.");
      LogFinisher::operator=((LogFinisher *)((long)&i_15 + 3),other);
      LogMessage::~LogMessage(&local_98);
      break;
    case TYPE_UINT32:
      for (i_4 = 0; iVar1 = i_4,
          iVar3 = RepeatedField<unsigned_int>::size((this->field_0).repeated_uint32_value),
          iVar1 < iVar3; i_4 = i_4 + 1) {
        puVar4 = RepeatedField<unsigned_int>::Get((this->field_0).repeated_uint32_value,i_4);
        _i_1 = WireFormatLite::WriteUInt32NoTagToArray(*puVar4,_i_1);
      }
      break;
    case TYPE_ENUM:
      for (local_60 = 0; iVar1 = local_60,
          iVar3 = RepeatedField<int>::size((this->field_0).repeated_int32_value), iVar1 < iVar3;
          local_60 = local_60 + 1) {
        piVar5 = RepeatedField<int>::Get((this->field_0).repeated_int32_value,local_60);
        _i_1 = WireFormatLite::WriteEnumNoTagToArray(*piVar5,_i_1);
      }
      break;
    case TYPE_SFIXED32:
      for (i_10 = 0; iVar1 = i_10,
          iVar3 = RepeatedField<int>::size((this->field_0).repeated_int32_value), iVar1 < iVar3;
          i_10 = i_10 + 1) {
        piVar5 = RepeatedField<int>::Get((this->field_0).repeated_int32_value,i_10);
        _i_1 = WireFormatLite::WriteSFixed32NoTagToArray(*piVar5,_i_1);
      }
      break;
    case TYPE_SFIXED64:
      for (i_11 = 0; iVar1 = i_11,
          iVar3 = RepeatedField<long>::size((this->field_0).repeated_int64_value), iVar1 < iVar3;
          i_11 = i_11 + 1) {
        plVar6 = RepeatedField<long>::Get((this->field_0).repeated_int64_value,i_11);
        _i_1 = WireFormatLite::WriteSFixed64NoTagToArray(*plVar6,_i_1);
      }
      break;
    case TYPE_SINT32:
      for (i_6 = 0; iVar1 = i_6,
          iVar3 = RepeatedField<int>::size((this->field_0).repeated_int32_value), iVar1 < iVar3;
          i_6 = i_6 + 1) {
        piVar5 = RepeatedField<int>::Get((this->field_0).repeated_int32_value,i_6);
        _i_1 = WireFormatLite::WriteSInt32NoTagToArray(*piVar5,_i_1);
      }
      break;
    case MAX_TYPE:
      for (i_7 = 0; iVar1 = i_7,
          iVar3 = RepeatedField<long>::size((this->field_0).repeated_int64_value), iVar1 < iVar3;
          i_7 = i_7 + 1) {
        plVar6 = RepeatedField<long>::Get((this->field_0).repeated_int64_value,i_7);
        _i_1 = WireFormatLite::WriteSInt64NoTagToArray(*plVar6,_i_1);
      }
    }
  }
  return _i_1;
}

Assistant:

uint8* ExtensionSet::Extension::InternalSerializeFieldWithCachedSizesToArray(
    int number, bool deterministic, uint8* target) const {
  if (is_repeated) {
    if (is_packed) {
      if (cached_size == 0) return target;

      target = WireFormatLite::WriteTagToArray(number,
          WireFormatLite::WIRETYPE_LENGTH_DELIMITED, target);
      target = WireFormatLite::WriteInt32NoTagToArray(cached_size, target);

      switch (real_type(type)) {
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                        \
        case FieldDescriptor::TYPE_##UPPERCASE:                             \
          for (int i = 0; i < repeated_##LOWERCASE##_value->size(); i++) {  \
            target = WireFormatLite::Write##CAMELCASE##NoTagToArray(        \
              repeated_##LOWERCASE##_value->Get(i), target);                \
          }                                                                 \
          break

        HANDLE_TYPE(   INT32,    Int32,   int32);
        HANDLE_TYPE(   INT64,    Int64,   int64);
        HANDLE_TYPE(  UINT32,   UInt32,  uint32);
        HANDLE_TYPE(  UINT64,   UInt64,  uint64);
        HANDLE_TYPE(  SINT32,   SInt32,   int32);
        HANDLE_TYPE(  SINT64,   SInt64,   int64);
        HANDLE_TYPE( FIXED32,  Fixed32,  uint32);
        HANDLE_TYPE( FIXED64,  Fixed64,  uint64);
        HANDLE_TYPE(SFIXED32, SFixed32,   int32);
        HANDLE_TYPE(SFIXED64, SFixed64,   int64);
        HANDLE_TYPE(   FLOAT,    Float,   float);
        HANDLE_TYPE(  DOUBLE,   Double,  double);
        HANDLE_TYPE(    BOOL,     Bool,    bool);
        HANDLE_TYPE(    ENUM,     Enum,    enum);
#undef HANDLE_TYPE

        case WireFormatLite::TYPE_STRING:
        case WireFormatLite::TYPE_BYTES:
        case WireFormatLite::TYPE_GROUP:
        case WireFormatLite::TYPE_MESSAGE:
          GOOGLE_LOG(FATAL) << "Non-primitive types can't be packed.";
          break;
      }
    } else {
      switch (real_type(type)) {
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                        \
        case FieldDescriptor::TYPE_##UPPERCASE:                             \
          for (int i = 0; i < repeated_##LOWERCASE##_value->size(); i++) {  \
            target = WireFormatLite::Write##CAMELCASE##ToArray(number,      \
              repeated_##LOWERCASE##_value->Get(i), target);                \
          }                                                                 \
          break

        HANDLE_TYPE(   INT32,    Int32,   int32);
        HANDLE_TYPE(   INT64,    Int64,   int64);
        HANDLE_TYPE(  UINT32,   UInt32,  uint32);
        HANDLE_TYPE(  UINT64,   UInt64,  uint64);
        HANDLE_TYPE(  SINT32,   SInt32,   int32);
        HANDLE_TYPE(  SINT64,   SInt64,   int64);
        HANDLE_TYPE( FIXED32,  Fixed32,  uint32);
        HANDLE_TYPE( FIXED64,  Fixed64,  uint64);
        HANDLE_TYPE(SFIXED32, SFixed32,   int32);
        HANDLE_TYPE(SFIXED64, SFixed64,   int64);
        HANDLE_TYPE(   FLOAT,    Float,   float);
        HANDLE_TYPE(  DOUBLE,   Double,  double);
        HANDLE_TYPE(    BOOL,     Bool,    bool);
        HANDLE_TYPE(  STRING,   String,  string);
        HANDLE_TYPE(   BYTES,    Bytes,  string);
        HANDLE_TYPE(    ENUM,     Enum,    enum);
#undef HANDLE_TYPE
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                        \
        case FieldDescriptor::TYPE_##UPPERCASE:                             \
          for (int i = 0; i < repeated_##LOWERCASE##_value->size(); i++) {  \
            target = WireFormatLite::InternalWrite##CAMELCASE##ToArray(     \
                      number, repeated_##LOWERCASE##_value->Get(i),         \
                      deterministic, target);                               \
          }                                                                 \
          break

        HANDLE_TYPE(   GROUP,    Group, message);
        HANDLE_TYPE( MESSAGE,  Message, message);
#undef HANDLE_TYPE
      }
    }
  } else if (!is_cleared) {
    switch (real_type(type)) {
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, VALUE)                 \
      case FieldDescriptor::TYPE_##UPPERCASE:                    \
        target = WireFormatLite::Write##CAMELCASE##ToArray(      \
            number, VALUE, target); \
        break

      HANDLE_TYPE(   INT32,    Int32,    int32_value);
      HANDLE_TYPE(   INT64,    Int64,    int64_value);
      HANDLE_TYPE(  UINT32,   UInt32,   uint32_value);
      HANDLE_TYPE(  UINT64,   UInt64,   uint64_value);
      HANDLE_TYPE(  SINT32,   SInt32,    int32_value);
      HANDLE_TYPE(  SINT64,   SInt64,    int64_value);
      HANDLE_TYPE( FIXED32,  Fixed32,   uint32_value);
      HANDLE_TYPE( FIXED64,  Fixed64,   uint64_value);
      HANDLE_TYPE(SFIXED32, SFixed32,    int32_value);
      HANDLE_TYPE(SFIXED64, SFixed64,    int64_value);
      HANDLE_TYPE(   FLOAT,    Float,    float_value);
      HANDLE_TYPE(  DOUBLE,   Double,   double_value);
      HANDLE_TYPE(    BOOL,     Bool,     bool_value);
      HANDLE_TYPE(  STRING,   String,  *string_value);
      HANDLE_TYPE(   BYTES,    Bytes,  *string_value);
      HANDLE_TYPE(    ENUM,     Enum,     enum_value);
      HANDLE_TYPE(   GROUP,    Group, *message_value);
#undef HANDLE_TYPE
      case FieldDescriptor::TYPE_MESSAGE:
        if (is_lazy) {
          target = lazymessage_value->InternalWriteMessageToArray(
              number, deterministic, target);
        } else {
          target = WireFormatLite::InternalWriteMessageToArray(
              number, *message_value, deterministic, target);
        }
        break;
    }
  }
  return target;
}